

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_algebraic.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_84db9::ir_algebraic_visitor::handle_rvalue
          (ir_algebraic_visitor *this,ir_rvalue **rvalue)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ir_constant *ir1;
  long *plVar5;
  ir_instruction *piVar6;
  exec_node *peVar7;
  exec_node *peVar8;
  ir_rvalue *piVar9;
  _func_int **pp_Var10;
  long lVar11;
  ir_constant *piVar12;
  bool bVar13;
  byte bVar14;
  char cVar15;
  uint i_2;
  int iVar16;
  uint uVar17;
  operand oVar18;
  ir_constant *piVar19;
  void *pvVar20;
  undefined4 extraout_var;
  ir_expression *piVar21;
  ir_expression *this_00;
  ir_swizzle *this_01;
  ir_variable *piVar22;
  ir_assignment *piVar23;
  ir_rvalue *piVar24;
  ir_variable *this_02;
  operand oVar25;
  ir_constant *extraout_RAX;
  ir_constant *piVar26;
  operand oVar27;
  ir_constant *extraout_RAX_00;
  ir_rvalue *piVar28;
  glsl_type *pgVar29;
  int i_1;
  uint uVar30;
  long lVar31;
  uint count;
  ir_rvalue **ppiVar32;
  operand *this_03;
  ir_expression_operation iVar33;
  ir_expression *in_R8;
  ir_expression **ppiVar34;
  long lVar35;
  ir_rvalue *piVar36;
  uint i;
  ulong uVar37;
  long lVar38;
  undefined8 *puVar39;
  undefined4 uVar40;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar41;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ir_constant *op_const [4];
  ir_expression *op_expr [4];
  operand local_e0;
  operand local_d8;
  long local_d0;
  ir_constant_data data;
  operand local_48;
  operand local_40;
  operand local_38;
  
  ir1 = (ir_constant *)*rvalue;
  if (ir1 == (ir_constant *)0x0) {
    return;
  }
  if ((ir1->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
    return;
  }
  if ((ir1->value).u[0] == ir_last_opcode) {
    return;
  }
  uVar40 = 0;
  uVar41 = 0;
  op_const[2] = (ir_constant *)0x0;
  op_const[3] = (ir_constant *)0x0;
  op_const[0] = (ir_constant *)0x0;
  op_const[1] = (ir_constant *)0x0;
  op_expr[2] = (ir_expression *)0x0;
  op_expr[3] = (ir_expression *)0x0;
  op_expr[0] = (ir_expression *)0x0;
  op_expr[1] = (ir_expression *)0x0;
  if ((((((ir1->value).u[0] == ir_binop_mul) &&
        (pgVar29 = ((ir_rvalue *)(ir1->value).u64[1])->type, 1 < pgVar29->matrix_columns)) &&
       ((byte)pgVar29->field_0x4 - 2 < 3)) &&
      ((bVar13 = glsl_type::is_vector(((ir_rvalue *)(ir1->value).u64[2])->type),
       uVar40 = extraout_XMM0_Da, uVar41 = extraout_XMM0_Db, bVar13 &&
       (piVar24 = (ir_rvalue *)(ir1->value).u64[1], piVar24 != (ir_rvalue *)0x0)))) &&
     (((piVar24->super_ir_instruction).ir_type == ir_type_expression &&
      (*(int *)&piVar24[1].super_ir_instruction._vptr_ir_instruction == 0x73)))) {
    oVar25.val = (ir_rvalue *)piVar24[1].super_ir_instruction.super_exec_node.next;
    if (((oVar25.val)->type->matrix_columns < 2) || (2 < (byte)(oVar25.val)->type->field_0x4 - 2))
    goto LAB_0017ae48;
    oVar18.val = (ir_rvalue *)piVar24[1].super_ir_instruction.super_exec_node.prev;
    pgVar29 = (oVar18.val)->type;
    if ((pgVar29->matrix_columns < 2) || (2 < (byte)pgVar29->field_0x4 - 2)) goto LAB_0017ae48;
    oVar18.val = &ir_builder::mul(oVar18,(ir_rvalue *)(ir1->value).d[2])->super_ir_rvalue;
LAB_0017ae3e:
    piVar19 = (ir_constant *)ir_builder::mul(oVar25,oVar18);
    goto switchD_0017af5d_default;
  }
LAB_0017ae48:
  bVar14 = (ir1->value).b[0x28];
  if (4 < bVar14) {
    __assert_fail("ir->num_operands <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                  ,0x14e,
                  "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                 );
  }
  for (uVar37 = 0; piVar19 = ir1, uVar37 < bVar14; uVar37 = uVar37 + 1) {
    plVar5 = *(long **)((long)&ir1->value + uVar37 * 8 + 8);
    if ((1 < *(byte *)(plVar5[4] + 9)) && (*(byte *)(plVar5[4] + 4) - 2 < 3))
    goto switchD_0017aeea_caseD_5e;
    pvVar20 = ralloc_parent(ir1);
    piVar19 = (ir_constant *)(**(code **)(*plVar5 + 0x30))(plVar5,pvVar20,0);
    op_const[uVar37] = piVar19;
    piVar21 = *(ir_expression **)((long)&ir1->value + uVar37 * 8 + 8);
    if ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression) {
      piVar21 = (ir_expression *)0x0;
    }
    op_expr[uVar37] = piVar21;
    bVar14 = (ir1->value).b[0x28];
    uVar40 = extraout_XMM0_Da_00;
    uVar41 = extraout_XMM0_Db_00;
  }
  pvVar20 = this->mem_ctx;
  if (pvVar20 == (void *)0x0) {
    pvVar20 = ralloc_parent(ir1);
    this->mem_ctx = pvVar20;
    uVar40 = extraout_XMM0_Da_01;
    uVar41 = extraout_XMM0_Db_01;
  }
  piVar21 = op_expr[0];
  piVar12 = op_const[2];
  piVar26 = op_const[0];
  switch((ir1->value).u[0]) {
  case 0x5b:
    if ((op_expr[0] == (ir_expression *)0x0) || (op_expr[0]->operation != ir_binop_add))
    goto switchD_0017af5d_default;
    piVar24 = op_expr[0]->operands[0];
    piVar28 = (ir_rvalue *)0x0;
    if ((op_expr[0]->operands[1]->super_ir_instruction).ir_type == ir_type_expression) {
      piVar28 = op_expr[0]->operands[1];
    }
    if ((((piVar24 == (ir_rvalue *)0x0) ||
         ((piVar24->super_ir_instruction).ir_type != ir_type_expression)) ||
        (piVar28 == (ir_rvalue *)0x0)) ||
       ((*(int *)&piVar24[1].super_ir_instruction._vptr_ir_instruction != 0x10 ||
        (*(int *)&piVar28[1].super_ir_instruction._vptr_ir_instruction != 0x10))))
    goto switchD_0017af5d_default;
    oVar25.val = &ir_builder::logic_or
                            ((ir_rvalue *)piVar24[1].super_ir_instruction.super_exec_node.next,
                             (ir_rvalue *)piVar28[1].super_ir_instruction.super_exec_node.next)->
                  super_ir_rvalue;
LAB_0017c3f7:
    piVar19 = (ir_constant *)ir_builder::b2f(oVar25);
    goto switchD_0017af5d_default;
  case 0x5c:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_unop_unpack_double_2x32;
    goto LAB_0017b99e;
  case 0x5d:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_unop_pack_double_2x32;
    goto LAB_0017b99e;
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x66:
  case 0x67:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x91:
    goto switchD_0017aeea_caseD_5e;
  case 0x65:
  case 0x8f:
  case 0x90:
    if (op_const[0] == (ir_constant *)0x0) goto switchD_0017af5d_default;
    break;
  case 0x68:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_unop_unpack_int_2x32;
    goto LAB_0017b99e;
  case 0x69:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_last_unop;
    goto LAB_0017b99e;
  case 0x6a:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_unop_pack_int_2x32;
    goto LAB_0017b99e;
  case 0x6b:
    piVar21 = (ir_expression *)(ir1->value).u64[1];
    if ((piVar21 == (ir_expression *)0x0) ||
       ((piVar21->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_expression))
    goto switchD_0017af5d_default;
    bVar13 = piVar21->operation == ir_unop_pack_uint_2x32;
    goto LAB_0017b99e;
  case 0x6c:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[0]), (char)iVar16 != '\0')) goto LAB_0017b7bf;
    piVar19 = op_const[1];
    if ((op_const[1] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[1]), (char)iVar16 != '\0')) break;
    for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
      piVar21 = op_expr[uVar37];
      if ((((piVar21 != (ir_expression *)0x0) && (piVar21->operation == ir_unop_neg)) &&
          (lVar38 = *(long *)((long)&ir1->value + (uVar37 ^ 1) * 8 + 8), lVar38 != 0)) &&
         (iVar16 = (*(piVar21->operands[0]->super_ir_instruction)._vptr_ir_instruction[5])
                             (piVar21->operands[0],lVar38,0x17), (char)iVar16 != '\0'))
      goto LAB_0017b49f;
    }
    if (piVar19 == (ir_constant *)0x0 && piVar26 != (ir_constant *)0x0) {
      iVar16 = 0;
      piVar19 = (ir_constant *)op_expr[1];
LAB_0017be16:
      reassociate_constant(this,(ir_expression *)ir1,iVar16,piVar19,in_R8);
    }
    else if (piVar26 == (ir_constant *)0x0 && piVar19 != (ir_constant *)0x0) {
      iVar16 = 1;
      piVar19 = (ir_constant *)op_expr[0];
      goto LAB_0017be16;
    }
    if ((((this->options->OptimizeForAOS != '\0') && (op_expr[0] != (ir_expression *)0x0)) &&
        ((op_expr[0]->operation == ir_binop_add &&
         ((op_expr[1] != (ir_expression *)0x0 &&
          (((op_expr[0]->super_ir_rvalue).type)->field_0x4 == '\x02')))))) &&
       ((op_expr[1]->operation == ir_binop_add &&
        (((op_expr[1]->super_ir_rvalue).type)->field_0x4 == '\x02')))) {
      piVar28 = (ir_rvalue *)0x0;
      piVar24 = op_expr[0]->operands[1];
      if ((op_expr[0]->operands[1]->super_ir_instruction).ir_type != ir_type_swizzle) {
        piVar24 = piVar28;
      }
      piVar36 = op_expr[1]->operands[0];
      if ((op_expr[1]->operands[0]->super_ir_instruction).ir_type != ir_type_swizzle) {
        piVar36 = piVar28;
      }
      piVar9 = op_expr[0]->operands[0];
      if ((op_expr[1]->operands[1]->super_ir_instruction).ir_type == ir_type_swizzle) {
        piVar28 = op_expr[1]->operands[1];
      }
      if ((((piVar9 != (ir_rvalue *)0x0) &&
           ((piVar9->super_ir_instruction).ir_type == ir_type_swizzle)) &&
          (piVar24 != (ir_rvalue *)0x0)) &&
         (((uVar1 = *(ushort *)&piVar9[1].super_ir_instruction.super_exec_node.next,
           (uVar1 & 0x700) == 0x100 && (piVar36 != (ir_rvalue *)0x0)) &&
          (((uVar2 = *(ushort *)&piVar24[1].super_ir_instruction.super_exec_node.next,
            (uVar2 & 0x700) == 0x100 &&
            ((piVar28 != (ir_rvalue *)0x0 &&
             (uVar3 = *(ushort *)&piVar36[1].super_ir_instruction.super_exec_node.next,
             (uVar3 & 0x700) == 0x100)))) &&
           (uVar4 = *(ushort *)&piVar28[1].super_ir_instruction.super_exec_node.next,
           (uVar4 & 0x700) == 0x100)))))) {
        pvVar20 = this->mem_ctx;
        data.u64[0] = data.u64[0] & 0xffffffff00000000;
        data.b[uVar1 & 3] = true;
        data.b[uVar2 & 3] = true;
        data.b[uVar3 & 3] = true;
        data.b[uVar4 & 3] = true;
        if ((((data.b[0] == true) && (data.b[1] == true)) && (data.b[2] == true)) &&
           (((data.b[3] == true &&
             (pp_Var10 = piVar9[1].super_ir_instruction._vptr_ir_instruction,
             cVar15 = (**(code **)(*pp_Var10 + 0x28))
                                (pp_Var10,piVar24[1].super_ir_instruction._vptr_ir_instruction,0x17)
             , cVar15 != '\0')) &&
            ((pp_Var10 = piVar9[1].super_ir_instruction._vptr_ir_instruction,
             cVar15 = (**(code **)(*pp_Var10 + 0x28))
                                (pp_Var10,piVar36[1].super_ir_instruction._vptr_ir_instruction,0x17)
             , cVar15 != '\0' &&
             (pp_Var10 = piVar9[1].super_ir_instruction._vptr_ir_instruction,
             cVar15 = (**(code **)(*pp_Var10 + 0x28))
                                (pp_Var10,piVar28[1].super_ir_instruction._vptr_ir_instruction,0x17)
             , cVar15 != '\0')))))) {
          oVar25.val = (ir_rvalue *)piVar9[1].super_ir_instruction._vptr_ir_instruction;
          oVar18.val = (ir_rvalue *)exec_node::operator_new(0xb0,pvVar20);
          ir_constant::ir_constant((ir_constant *)oVar18.val,1.0,4);
          piVar19 = (ir_constant *)ir_builder::dot(oVar25,oVar18);
          if (piVar19 != (ir_constant *)0x0) goto switchD_0017af5d_default;
        }
      }
    }
    for (lVar38 = 0; lVar38 != 2; lVar38 = lVar38 + 1) {
      piVar21 = op_expr[lVar38];
      if ((piVar21 != (ir_expression *)0x0) && (piVar21->operation == ir_binop_mul)) {
        for (lVar35 = 0; lVar35 != 2; lVar35 = lVar35 + 1) {
          piVar24 = piVar21->operands[lVar35];
          if (((piVar24 != (ir_rvalue *)0x0) &&
              ((piVar24->super_ir_instruction).ir_type == ir_type_expression)) &&
             (*(int *)&piVar24[1].super_ir_instruction._vptr_ir_instruction == 0x6c)) {
            local_d0 = 1 - lVar35;
            piVar6 = &piVar24[1].super_ir_instruction;
            lVar31 = 0;
            while( true ) {
              if (lVar31 == 2) break;
              peVar8 = (&piVar24[1].super_ir_instruction.super_exec_node.next)[lVar31];
              if (((peVar8 != (exec_node *)0x0) && (*(int *)&peVar8[1].prev == 4)) &&
                 (*(int *)&peVar8[2].prev == 2)) {
                oVar25.val = *(ir_rvalue **)((long)ir1 + (1 - lVar38) * 8 + 0x30);
                cVar15 = (*(code *)(peVar8[3].next)->next[2].prev)(peVar8[3].next,oVar25.val,0x17);
                if (((cVar15 != '\0') &&
                    (pgVar29 = (oVar25.val)->type, (byte)pgVar29->field_0x4 - 2 < 3)) &&
                   ((oVar18.val = (ir_rvalue *)(piVar6->super_exec_node).prev,
                    pgVar29 == (oVar18.val)->type && (pgVar29 == piVar21->operands[local_d0]->type))
                   )) {
                  piVar19 = (ir_constant *)
                            ir_builder::lrp(oVar25,oVar18,piVar21->operands[local_d0]);
                  goto switchD_0017af5d_default;
                }
              }
              lVar31 = lVar31 + 1;
              piVar6 = (ir_instruction *)(&piVar6->super_exec_node + -1);
            }
          }
        }
      }
    }
    goto switchD_0017aeea_caseD_5e;
  case 0x6d:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar16 != '\0')) {
LAB_0017b51b:
      oVar25.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017b51f:
      piVar19 = (ir_constant *)ir_builder::neg(oVar25);
      goto switchD_0017af5d_default;
    }
LAB_0017b529:
    if (op_const[1] == (ir_constant *)0x0) goto switchD_0017af5d_default;
    iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])();
    cVar15 = (char)iVar16;
    goto LAB_0017bdf0;
  case 0x73:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[0]), (char)iVar16 != '\0')) goto LAB_0017b7bf;
    piVar19 = op_const[1];
    if ((op_const[1] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[1]), (char)iVar16 != '\0')) break;
    if (((piVar26 != (ir_constant *)0x0) &&
        (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (piVar26), (char)iVar16 != '\0')) ||
       ((piVar19 != (ir_constant *)0x0 &&
        (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (piVar19), (char)iVar16 != '\0')))) {
LAB_0017b49f:
      pgVar29 = (ir1->super_ir_rvalue).type;
      piVar19 = ir1;
      goto LAB_0017c20a;
    }
    if ((piVar26 != (ir_constant *)0x0) &&
       (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xc])
                           (piVar26), (char)iVar16 != '\0')) goto LAB_0017b51b;
    if ((piVar19 != (ir_constant *)0x0) &&
       (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xc])
                           (piVar19), (char)iVar16 != '\0')) {
      oVar25.val = (ir_rvalue *)(ir1->value).d[1];
      goto LAB_0017b51f;
    }
    if (((op_expr[0] != (ir_expression *)0x0) &&
        (op_expr[1] != (ir_expression *)0x0 && op_expr[0]->operation == ir_unop_b2f)) &&
       (op_expr[1]->operation == ir_unop_b2f)) {
      oVar25.val = &ir_builder::logic_and(op_expr[0]->operands[0],op_expr[1]->operands[0])->
                    super_ir_rvalue;
      goto LAB_0017c3f7;
    }
    if (piVar19 == (ir_constant *)0x0 && piVar26 != (ir_constant *)0x0) {
      iVar16 = 0;
      piVar19 = (ir_constant *)op_expr[1];
LAB_0017c4e5:
      reassociate_constant(this,(ir_expression *)ir1,iVar16,piVar19,in_R8);
    }
    else if (piVar26 == (ir_constant *)0x0 && piVar19 != (ir_constant *)0x0) {
      iVar16 = 1;
      piVar19 = (ir_constant *)op_expr[0];
      goto LAB_0017c4e5;
    }
    for (lVar38 = 0; lVar38 != 2; lVar38 = lVar38 + 1) {
      lVar35 = *(long *)((long)&ir1->value + (ulong)(uint)((1 - (int)lVar38) * 8) + 8);
      oVar25.val = *(ir_rvalue **)((long)&ir1->value + lVar38 * 8 + 8);
      if (*(int *)(lVar35 + 0x18) != 4) {
        lVar35 = 0;
      }
      if (((((oVar25.val != (ir_rvalue *)0x0) &&
            (((oVar25.val)->super_ir_instruction).ir_type == ir_type_expression)) &&
           ((lVar35 != 0 &&
            ((*(int *)&oVar25.val[1].super_ir_instruction._vptr_ir_instruction == 4 &&
             (*(int *)(lVar35 + 0x28) == 0x40)))))) &&
          (lVar35 = *(long *)(lVar35 + 0x30), lVar35 != 0)) &&
         ((*(int *)(lVar35 + 0x18) == 4 && (*(int *)(lVar35 + 0x28) == 0x6c)))) {
        puVar39 = (undefined8 *)(lVar35 + 0x38);
        for (lVar31 = 0; lVar31 != 2; lVar31 = lVar31 + 1) {
          lVar11 = *(long *)(lVar35 + 0x30 + lVar31 * 8);
          if ((((lVar11 != 0) && (*(int *)(lVar11 + 0x18) == 4)) && (*(int *)(lVar11 + 0x28) == 3))
             && (((oVar18.val = (ir_rvalue *)*puVar39, oVar18.val != (ir_rvalue *)0x0 &&
                  (((oVar18.val)->super_ir_instruction).ir_type == ir_type_constant)) &&
                 ((iVar16 = (*((oVar18.val)->super_ir_instruction)._vptr_ir_instruction[0xe])
                                      (0x3f000000,oVar18.val,0), (char)iVar16 != '\0' &&
                  (cVar15 = (**(code **)(**(long **)(lVar11 + 0x30) + 0x28))
                                      (*(long **)(lVar11 + 0x30),
                                       oVar25.val[1].super_ir_instruction.super_exec_node.next,0x17)
                  , cVar15 != '\0')))))) {
            oVar27.val = *(ir_rvalue **)(lVar11 + 0x30);
            oVar25.val = &ir_builder::mul(oVar25,oVar18)->super_ir_rvalue;
            ir_builder::add(oVar27,oVar25);
            ir_builder::trunc((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            piVar19 = extraout_RAX_00;
            goto switchD_0017af5d_default;
          }
          puVar39 = puVar39 + -1;
        }
      }
    }
    goto switchD_0017aeea_caseD_5e;
  case 0x76:
    if (((op_const[0] != (ir_constant *)0x0) &&
        (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])()
        , (char)iVar16 != '\0')) &&
       ((cVar15 = ((ir1->super_ir_rvalue).type)->field_0x4, cVar15 == '\x04' || (cVar15 == '\x02')))
       ) {
      piVar19 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
      this_00 = (ir_expression *)(ir1->value).u64[2];
      pgVar29 = (this_00->super_ir_rvalue).type;
      iVar33 = ir_unop_rcp;
LAB_0017b33b:
      this_01 = (ir_swizzle *)0x0;
LAB_0017c48d:
      ir_expression::ir_expression
                ((ir_expression *)piVar19,iVar33,pgVar29,&this_00->super_ir_rvalue,
                 &this_01->super_ir_rvalue,(ir_rvalue *)0x0,(ir_rvalue *)0x0);
      goto switchD_0017af5d_default;
    }
    if (op_const[1] == (ir_constant *)0x0) goto switchD_0017af5d_default;
    iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])();
    cVar15 = (char)iVar16;
LAB_0017bdf0:
    if (cVar15 == '\0') goto switchD_0017af5d_default;
    break;
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    ppiVar34 = op_expr;
    for (lVar38 = 1; lVar38 != -1; lVar38 = lVar38 + -1) {
      piVar21 = *ppiVar34;
      if ((((piVar21 != (ir_expression *)0x0) && (piVar21->operation == ir_binop_add)) &&
          (op_const[lVar38] != (ir_constant *)0x0)) &&
         ((iVar16 = (*(op_const[lVar38]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                      [10])(), (char)iVar16 != '\0' &&
          (piVar21->operands[0]->type == piVar21->operands[1]->type)))) {
        piVar19 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
        iVar33 = (ir1->value).i[0];
        oVar25.val = piVar21->operands[0];
        if (lVar38 == 0) {
          oVar25.val = &ir_builder::neg(oVar25)->super_ir_rvalue;
          piVar21 = (ir_expression *)piVar21->operands[1];
        }
        else {
          piVar21 = ir_builder::neg(piVar21->operands[1]);
        }
        goto LAB_0017c1d7;
      }
      ppiVar34 = ppiVar34 + 1;
    }
    goto switchD_0017aeea_caseD_5e;
  case 0x7e:
  case 0x7f:
    pgVar29 = ((ir_rvalue *)(ir1->value).u64[1])->type;
    if (((pgVar29->vector_elements == '\x01') &&
        (((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe &&
         (pgVar29 = ((ir_rvalue *)(ir1->value).u64[2])->type, pgVar29->vector_elements == '\x01'))))
       && ((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe)) {
      piVar19 = (ir_constant *)exec_node::operator_new(0x58,pvVar20);
      iVar33 = (ir1->value).u[0] == ir_binop_all_equal ^ ir_binop_nequal;
      oVar25.val = (ir_rvalue *)(ir1->value).d[1];
      piVar21 = (ir_expression *)(ir1->value).d[2];
LAB_0017c1d7:
      ir_expression::ir_expression
                ((ir_expression *)piVar19,iVar33,oVar25.val,&piVar21->super_ir_rvalue);
    }
    goto switchD_0017af5d_default;
  case 0x80:
  case 0x81:
    if ((op_const[0] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar16 == '\0')) goto LAB_0017b529;
    break;
  case 0x85:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[0]), (char)iVar16 != '\0')) goto LAB_0017b7bf;
    piVar12 = op_const[1];
    if ((op_const[1] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[1]), (char)iVar16 == '\0')) {
      if (((piVar26 == (ir_constant *)0x0) ||
          (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar26), (char)iVar16 == '\0')) &&
         ((piVar12 == (ir_constant *)0x0 ||
          (iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                              (piVar12), (char)iVar16 == '\0')))) {
        if (((op_expr[0] != (ir_expression *)0x0) &&
            (op_expr[1] != (ir_expression *)0x0 && op_expr[0]->operation == ir_unop_logic_not)) &&
           (op_expr[1]->operation == ir_unop_logic_not)) {
          oVar25.val = &ir_builder::logic_or(op_expr[0]->operands[0],op_expr[1]->operands[0])->
                        super_ir_rvalue;
          goto LAB_0017bdd5;
        }
LAB_0017bddf:
        iVar16 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction
                   [5])((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
        cVar15 = (char)iVar16;
        goto LAB_0017bdf0;
      }
      piVar19 = (ir_constant *)this->mem_ctx;
LAB_0017c206:
      pgVar29 = (ir1->super_ir_rvalue).type;
LAB_0017c20a:
      piVar19 = ir_constant::zero(piVar19,pgVar29);
      goto switchD_0017af5d_default;
    }
    break;
  case 0x86:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[0]), (char)iVar16 != '\0')) goto LAB_0017b7bf;
    piVar12 = op_const[1];
    if ((op_const[1] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[1]), (char)iVar16 == '\0')) {
      if ((piVar26 != (ir_constant *)0x0) &&
         (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar26), (char)iVar16 != '\0')) {
        oVar25.val = (ir_rvalue *)(ir1->value).d[2];
LAB_0017bdd5:
        piVar19 = (ir_constant *)ir_builder::logic_not(oVar25);
        goto switchD_0017af5d_default;
      }
      if (piVar12 == (ir_constant *)0x0) {
        oVar25.val = (ir_rvalue *)(ir1->value).u64[1];
      }
      else {
        iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (piVar12);
        oVar25.val = (ir_rvalue *)(ir1->value).u64[1];
        if ((char)iVar16 != '\0') goto LAB_0017bdd5;
      }
      iVar16 = (*((oVar25.val)->super_ir_instruction)._vptr_ir_instruction[5])
                         (oVar25.val,(ir_rvalue *)(ir1->value).d[2],0x17);
      if ((char)iVar16 == '\0') goto switchD_0017af5d_default;
LAB_0017c1fd:
      piVar19 = (ir_constant *)this->mem_ctx;
      goto LAB_0017c206;
    }
    break;
  case 0x87:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[0]), (char)iVar16 != '\0')) goto LAB_0017b7bf;
    piVar12 = op_const[1];
    if ((op_const[1] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                           (op_const[1]), (char)iVar16 == '\0')) {
      if (((piVar26 != (ir_constant *)0x0) &&
          (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                              (piVar26), (char)iVar16 != '\0')) ||
         ((piVar12 != (ir_constant *)0x0 &&
          (iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                              (piVar12), (char)iVar16 != '\0')))) {
        for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 1) {
          data.b[lVar38] = true;
        }
        piVar19 = (ir_constant *)exec_node::operator_new(0xb0,this->mem_ctx);
        ir_constant::ir_constant(piVar19,(ir1->super_ir_rvalue).type,&data);
        goto switchD_0017af5d_default;
      }
      if (((op_expr[0] == (ir_expression *)0x0) ||
          (op_expr[1] == (ir_expression *)0x0 || op_expr[0]->operation != ir_unop_logic_not)) ||
         (op_expr[1]->operation != ir_unop_logic_not)) goto LAB_0017bddf;
      oVar25.val = &ir_builder::logic_and(op_expr[0]->operands[0],op_expr[1]->operands[0])->
                    super_ir_rvalue;
      goto LAB_0017bdd5;
    }
    break;
  case 0x88:
    if (op_const[0] == (ir_constant *)0x0) {
      piVar26 = op_const[1];
      if (op_const[1] == (ir_constant *)0x0) goto switchD_0017af5d_default;
LAB_0017ba8c:
      iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])();
      if ((char)iVar16 != '\0') goto LAB_0017c1fd;
    }
    else {
      iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                         (op_const[0]);
      if ((char)iVar16 != '\0') goto LAB_0017c1fd;
      if (op_const[1] != (ir_constant *)0x0) goto LAB_0017ba8c;
    }
    data.d[0] = 0.0;
    data.d[1] = 0.0;
    uVar30 = 0;
    uVar37 = 0;
    while( true ) {
      uVar17 = (uint)((piVar26->super_ir_rvalue).type)->vector_elements;
      count = (uint)uVar37;
      if (uVar17 <= uVar30) break;
      iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar26);
      if ((char)iVar16 == '\0') {
        *(uint *)((long)&data + uVar37 * 4) = uVar30;
        uVar37 = (ulong)(count + 1);
      }
      uVar30 = uVar30 + 1;
    }
    if (count < uVar17) {
      iVar33 = ir_binop_dot;
      if (count == 1) {
        iVar33 = ir_binop_mul;
      }
      piVar19 = (ir_constant *)exec_node::operator_new(0x58,this->mem_ctx);
      pgVar29 = (ir1->super_ir_rvalue).type;
      this_00 = (ir_expression *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_swizzle::ir_swizzle((ir_swizzle *)this_00,(ir_rvalue *)(ir1->value).d[1],data.u,count);
      this_01 = (ir_swizzle *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_swizzle::ir_swizzle(this_01,(ir_rvalue *)(ir1->value).d[2],data.u,count);
      goto LAB_0017c48d;
    }
    goto switchD_0017aeea_caseD_5e;
  case 0x89:
  case 0x8a:
    if ((((ir1->super_ir_rvalue).type)->field_0x4 != '\x02') || (this->options->EmitNoSat != '\0'))
    goto switchD_0017af5d_default;
    for (lVar38 = 0; lVar38 != 2; lVar38 = lVar38 + 1) {
      piVar21 = op_expr[lVar38];
      piVar19 = *(ir_constant **)((long)op_const + (ulong)(uint)((1 - (int)lVar38) * 8));
      if ((piVar19 != (ir_constant *)0x0 && piVar21 != (ir_expression *)0x0) &&
         (piVar21->operation == ((ir1->value).u[0] != ir_binop_max) + ir_binop_min)) {
        if (((piVar21->operands[0] == (ir_rvalue *)0x0) ||
            ((piVar21->operands[0]->super_ir_instruction).ir_type != ir_type_constant)) &&
           ((piVar21->operands[1] == (ir_rvalue *)0x0 ||
            ((piVar21->operands[1]->super_ir_instruction).ir_type != ir_type_constant)))) break;
        ppiVar32 = piVar21->operands + 1;
        for (lVar35 = 0; lVar35 != 2; lVar35 = lVar35 + 1) {
          oVar25.val = *ppiVar32;
          if (((ir_constant *)oVar25.val != (ir_constant *)0x0) &&
             ((((ir_rvalue *)&(oVar25.val)->super_ir_instruction)->super_ir_instruction).ir_type ==
              ir_type_constant)) {
            oVar18.val = piVar21->operands[lVar35];
            iVar33 = (ir1->value).u[0];
            if (iVar33 == ir_binop_min) {
              iVar16 = (*(((ir_rvalue *)&(oVar25.val)->super_ir_instruction)->super_ir_instruction).
                         _vptr_ir_instruction[10])(oVar25.val);
              if (((char)iVar16 == '\0') ||
                 (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                             [0xb])(), (char)iVar16 == '\0')) {
                iVar33 = (ir1->value).u[0];
                goto LAB_0017b0e0;
              }
            }
            else {
LAB_0017b0e0:
              if (((iVar33 != ir_binop_max) ||
                  (iVar16 = (*(((ir_rvalue *)&(oVar25.val)->super_ir_instruction)->
                              super_ir_instruction)._vptr_ir_instruction[0xb])(oVar25.val),
                  (char)iVar16 == '\0')) ||
                 (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction
                             [10])(), (char)iVar16 == '\0')) {
                iVar33 = (ir1->value).u[0];
                if (iVar33 == ir_binop_min) {
                  iVar16 = (*(((ir_rvalue *)&(oVar25.val)->super_ir_instruction)->
                             super_ir_instruction)._vptr_ir_instruction[10])(oVar25.val);
                  if (((char)iVar16 == '\0') || (bVar13 = is_less_than_one(piVar19), !bVar13)) {
                    iVar33 = (ir1->value).u[0];
                    goto LAB_0017b137;
                  }
                  iVar33 = ir_binop_min;
                  oVar25.val = &piVar19->super_ir_rvalue;
                }
                else {
LAB_0017b137:
                  if (((iVar33 == ir_binop_max) &&
                      (bVar13 = is_less_than_one((ir_constant *)oVar25.val), bVar13)) &&
                     (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction.
                                 _vptr_ir_instruction[10])(), (char)iVar16 != '\0')) {
                    iVar33 = ir_binop_min;
                  }
                  else {
                    iVar33 = (ir1->value).u[0];
                    if (iVar33 == ir_binop_max) {
                      iVar16 = (*(((ir_rvalue *)&(oVar25.val)->super_ir_instruction)->
                                 super_ir_instruction)._vptr_ir_instruction[0xb])(oVar25.val);
                      if (((char)iVar16 != '\0') && (bVar13 = is_greater_than_zero(piVar19), bVar13)
                         ) {
                        iVar33 = ir_binop_max;
                        oVar25.val = &piVar19->super_ir_rvalue;
                        goto LAB_0017c4c6;
                      }
                      iVar33 = (ir1->value).u[0];
                    }
                    if (((iVar33 != ir_binop_min) ||
                        (bVar13 = is_greater_than_zero((ir_constant *)oVar25.val), !bVar13)) ||
                       (iVar16 = (*(piVar19->super_ir_rvalue).super_ir_instruction.
                                   _vptr_ir_instruction[0xb])(), (char)iVar16 == '\0'))
                    goto LAB_0017b1b2;
                    iVar33 = ir_binop_max;
                  }
                }
LAB_0017c4c6:
                oVar18.val = &ir_builder::expr(iVar33,oVar18,oVar25)->super_ir_rvalue;
              }
            }
            piVar19 = (ir_constant *)ir_builder::saturate(oVar18);
            goto switchD_0017af5d_default;
          }
LAB_0017b1b2:
          ppiVar32 = ppiVar32 + -1;
        }
      }
    }
switchD_0017aeea_caseD_5e:
    piVar19 = ir1;
    goto switchD_0017af5d_default;
  case 0x8b:
    if ((op_const[0] != (ir_constant *)0x0) &&
       (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[0]), piVar19 = piVar26, (char)iVar16 != '\0'))
    goto switchD_0017af5d_default;
    piVar12 = op_const[1];
    if ((op_const[1] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                           (op_const[1]), (char)iVar16 == '\0')) {
      bVar13 = is_vec_two(piVar26);
      if (bVar13) {
        piVar19 = (ir_constant *)ir_builder::expr(ir_unop_exp2,(ir_rvalue *)(ir1->value).d[2]);
        goto switchD_0017af5d_default;
      }
      bVar13 = is_vec_two(piVar12);
      if (bVar13) {
        piVar22 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar22,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar6 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar8 = &(piVar22->super_ir_instruction).super_exec_node;
        (piVar22->super_ir_instruction).super_exec_node.next = &piVar6->super_exec_node;
        peVar7 = (piVar6->super_exec_node).prev;
        (piVar22->super_ir_instruction).super_exec_node.prev = peVar7;
        peVar7->next = peVar8;
        (piVar6->super_exec_node).prev = peVar8;
        ir_builder::deref::deref((deref *)data.d,piVar22);
        piVar23 = ir_builder::assign((deref)data.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar23 != (ir_assignment *)0x0) {
          piVar23 = (ir_assignment *)&(piVar23->super_ir_instruction).super_exec_node;
        }
        (piVar23->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar6->super_exec_node;
        peVar8 = (piVar6->super_exec_node).prev;
        (piVar23->super_ir_instruction).super_exec_node.next = peVar8;
        peVar8->next = (exec_node *)piVar23;
        (piVar6->super_exec_node).prev = (exec_node *)piVar23;
        ir_builder::operand::operand(&local_d8,piVar22);
        this_03 = &local_e0;
        ir_builder::operand::operand(this_03,piVar22);
      }
      else {
        piVar19 = ir1;
        if ((piVar12 == (ir_constant *)0x0) ||
           (iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xe])
                               (0x40800000,piVar12,4), (char)iVar16 == '\0'))
        goto switchD_0017af5d_default;
        piVar22 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (piVar22,((ir_rvalue *)(ir1->value).u64[2])->type,"x",ir_var_temporary);
        piVar6 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar8 = &(piVar22->super_ir_instruction).super_exec_node;
        (piVar22->super_ir_instruction).super_exec_node.next = &piVar6->super_exec_node;
        peVar7 = (piVar6->super_exec_node).prev;
        (piVar22->super_ir_instruction).super_exec_node.prev = peVar7;
        peVar7->next = peVar8;
        (piVar6->super_exec_node).prev = peVar8;
        ir_builder::deref::deref((deref *)data.d,piVar22);
        piVar23 = ir_builder::assign((deref)data.d[0],(ir_rvalue *)(ir1->value).d[1]);
        if (piVar23 != (ir_assignment *)0x0) {
          piVar23 = (ir_assignment *)&(piVar23->super_ir_instruction).super_exec_node;
        }
        (piVar23->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar6->super_exec_node;
        peVar8 = (piVar6->super_exec_node).prev;
        (piVar23->super_ir_instruction).super_exec_node.next = peVar8;
        peVar8->next = (exec_node *)piVar23;
        (piVar6->super_exec_node).prev = (exec_node *)piVar23;
        this_02 = (ir_variable *)exec_node::operator_new(0x90,ir1);
        ir_variable::ir_variable
                  (this_02,((ir_rvalue *)(ir1->value).u64[2])->type,"squared",ir_var_temporary);
        piVar6 = (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                 super_ir_hierarchical_visitor.base_ir;
        peVar8 = &(this_02->super_ir_instruction).super_exec_node;
        (this_02->super_ir_instruction).super_exec_node.next = &piVar6->super_exec_node;
        peVar7 = (piVar6->super_exec_node).prev;
        (this_02->super_ir_instruction).super_exec_node.prev = peVar7;
        peVar7->next = peVar8;
        (piVar6->super_exec_node).prev = peVar8;
        ir_builder::deref::deref((deref *)&local_d8,this_02);
        ir_builder::operand::operand(&local_e0,piVar22);
        ir_builder::operand::operand(&local_38,piVar22);
        oVar25.val = &ir_builder::mul(local_e0,local_38)->super_ir_rvalue;
        piVar23 = ir_builder::assign((deref)local_d8.val,oVar25);
        if (piVar23 != (ir_assignment *)0x0) {
          piVar23 = (ir_assignment *)&(piVar23->super_ir_instruction).super_exec_node;
        }
        (piVar23->super_ir_instruction)._vptr_ir_instruction =
             (_func_int **)&piVar6->super_exec_node;
        peVar8 = (piVar6->super_exec_node).prev;
        (piVar23->super_ir_instruction).super_exec_node.next = peVar8;
        peVar8->next = (exec_node *)piVar23;
        (piVar6->super_exec_node).prev = (exec_node *)piVar23;
        ir_builder::operand::operand(&local_40,this_02);
        this_03 = &local_48;
        ir_builder::operand::operand(this_03,this_02);
        local_d8.val = local_40.val;
      }
      oVar18.val = this_03->val;
      oVar25.val = local_d8.val;
      goto LAB_0017ae3e;
    }
    break;
  case 0x92:
    if (((op_const[0] != (ir_constant *)0x0) &&
        (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (op_const[0]), (char)iVar16 != '\0')) ||
       ((piVar12 = op_const[1], op_const[1] != (ir_constant *)0x0 &&
        (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                            (op_const[1]), (char)iVar16 != '\0')))) {
LAB_0017b670:
      piVar19 = (ir_constant *)(ir1->value).u64[3];
      goto switchD_0017af5d_default;
    }
    if ((op_const[2] == (ir_constant *)0x0) ||
       (iVar16 = (*(op_const[2]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(),
       (char)iVar16 == '\0')) {
      if ((piVar26 == (ir_constant *)0x0) ||
         (iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                             (piVar26), (char)iVar16 == '\0')) {
        if ((piVar12 == (ir_constant *)0x0) ||
           (iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                               (piVar12), (char)iVar16 == '\0')) goto switchD_0017af5d_default;
        oVar25.val = (ir_rvalue *)(ir1->value).d[1];
      }
      else {
        oVar25.val = (ir_rvalue *)(ir1->value).d[2];
      }
      piVar19 = (ir_constant *)ir_builder::add(oVar25,(ir_rvalue *)(ir1->value).d[3]);
      goto switchD_0017af5d_default;
    }
    oVar18.val = (ir_rvalue *)(ir1->value).d[2];
    oVar25.val = (ir_rvalue *)(ir1->value).d[1];
    goto LAB_0017ae3e;
  case 0x93:
    if (op_const[2] != (ir_constant *)0x0) {
      iVar16 = (*(op_const[2]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                         (op_const[2]);
      if ((char)iVar16 != '\0') break;
      iVar16 = (*(piVar12->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])(piVar12)
      ;
      if ((char)iVar16 != '\0') goto LAB_0017b7bf;
    }
    iVar16 = (*(((ir_rvalue *)(ir1->value).u64[1])->super_ir_instruction)._vptr_ir_instruction[5])
                       ((ir_rvalue *)(ir1->value).u64[1],(ir_rvalue *)(ir1->value).d[2],0x17);
    if ((char)iVar16 == '\0') {
      if ((op_const[0] == (ir_constant *)0x0) ||
         (iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])()
         , (char)iVar16 == '\0')) {
        if ((op_const[1] == (ir_constant *)0x0) ||
           (iVar16 = (*(op_const[1]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])
                               (), (char)iVar16 == '\0')) goto switchD_0017af5d_default;
        uVar30 = (uint)((ir_rvalue *)(ir1->value).u64[3])->type->vector_elements;
        cVar15 = ((ir1->super_ir_rvalue).type)->field_0x4;
        if (cVar15 == '\x02') {
          oVar18.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar18.val,1.0,uVar30);
        }
        else if (cVar15 == '\x04') {
          oVar18.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar18.val,1.0,uVar30);
        }
        else {
          if (cVar15 != '\x03') {
            __assert_fail("!\"unexpected type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/opt_algebraic.cpp"
                          ,0x3e6,
                          "ir_rvalue *(anonymous namespace)::ir_algebraic_visitor::handle_expression(ir_expression *)"
                         );
          }
          oVar18.val = (ir_rvalue *)exec_node::operator_new(0xb0,this->mem_ctx);
          ir_constant::ir_constant((ir_constant *)oVar18.val,(float16_t)0x3c00,uVar30);
        }
        oVar25.val = (ir_rvalue *)(ir1->value).d[1];
        oVar27.val = &ir_builder::neg((ir_rvalue *)(ir1->value).d[3])->super_ir_rvalue;
        oVar18.val = &ir_builder::add(oVar18,oVar27)->super_ir_rvalue;
      }
      else {
        oVar18.val = (ir_rvalue *)(ir1->value).d[3];
        oVar25.val = (ir_rvalue *)(ir1->value).d[2];
      }
      goto LAB_0017ae3e;
    }
    break;
  case 0x94:
    if (op_const[0] == (ir_constant *)0x0) goto switchD_0017af5d_default;
    iVar16 = (*(op_const[0]->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[0xb])
                       (op_const[0]);
    if ((char)iVar16 == '\0') {
      iVar16 = (*(piVar26->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[10])(piVar26);
      if ((char)iVar16 == '\0') goto switchD_0017af5d_default;
      goto LAB_0017b670;
    }
LAB_0017b7bf:
    piVar19 = (ir_constant *)(ir1->value).u64[2];
    goto switchD_0017af5d_default;
  default:
    switch((ir1->value).u[0]) {
    case 0:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      bVar13 = op_expr[0]->operation == ir_unop_bit_not;
      break;
    case 1:
      if ((op_expr[0] == (ir_expression *)0x0) ||
         (uVar30 = op_expr[0]->operation - ir_binop_less, 5 < uVar30))
      goto switchD_0017af5d_default;
      iVar33 = *(ir_expression_operation *)(&DAT_002042e4 + (ulong)uVar30 * 4);
      piVar19 = (ir_constant *)exec_node::operator_new(0x58,pvVar20);
      pgVar29 = (ir1->super_ir_rvalue).type;
      this_00 = (ir_expression *)piVar21->operands[0];
      this_01 = (ir_swizzle *)piVar21->operands[1];
      goto LAB_0017c48d;
    case 2:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      bVar13 = op_expr[0]->operation == ir_unop_neg;
      break;
    case 3:
      if ((op_expr[0] != (ir_expression *)0x0) &&
         ((op_expr[0]->operation & ~ir_unop_logic_not) == ir_unop_neg)) {
        iVar16 = ir_builder::abs((int)op_expr[0]->operands[0]);
        piVar19 = (ir_constant *)CONCAT44(extraout_var,iVar16);
      }
      goto switchD_0017af5d_default;
    case 4:
    case 6:
    case 7:
      goto switchD_0017aeea_caseD_5e;
    case 5:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      switch(op_expr[0]->operation) {
      case ir_unop_rcp:
switchD_0017b883_caseD_5:
        piVar19 = (ir_constant *)op_expr[0]->operands[0];
        break;
      case ir_unop_rsq:
        ir_builder::sqrt((double)CONCAT44(uVar41,uVar40));
        piVar19 = extraout_RAX;
        break;
      case ir_unop_sqrt:
        piVar19 = (ir_constant *)ir_builder::rsq(op_expr[0]->operands[0]);
        break;
      case ir_unop_exp:
      case ir_unop_exp2:
        piVar19 = (ir_constant *)exec_node::operator_new(0x58,pvVar20);
        iVar33 = piVar21->operation;
        pgVar29 = (ir1->super_ir_rvalue).type;
        this_00 = ir_builder::neg(piVar21->operands[0]);
        goto LAB_0017b33b;
      case ir_unop_log:
        goto switchD_0017aeea_caseD_5e;
      }
      goto switchD_0017af5d_default;
    case 8:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      bVar13 = op_expr[0]->operation == ir_unop_log;
      break;
    case 9:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      bVar13 = op_expr[0]->operation == ir_unop_exp;
      break;
    case 10:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      if (op_expr[0]->operation == ir_unop_log2) goto switchD_0017b883_caseD_5;
      if ((op_expr[0]->operation != ir_binop_mul) || (this->options->EmitNoPow != '\0'))
      goto switchD_0017af5d_default;
      for (lVar38 = 0; lVar38 != 2; lVar38 = lVar38 + 1) {
        piVar24 = op_expr[0]->operands[lVar38];
        if (((piVar24 != (ir_rvalue *)0x0) &&
            ((piVar24->super_ir_instruction).ir_type == ir_type_expression)) &&
           (*(int *)&piVar24[1].super_ir_instruction._vptr_ir_instruction == 0xb)) {
          piVar19 = (ir_constant *)exec_node::operator_new(0x58,pvVar20);
          pgVar29 = (ir1->super_ir_rvalue).type;
          this_00 = (ir_expression *)piVar24[1].super_ir_instruction.super_exec_node.next;
          this_01 = (ir_swizzle *)piVar21->operands[1 - (int)lVar38];
          iVar33 = ir_binop_pow;
          goto LAB_0017c48d;
        }
      }
      goto switchD_0017aeea_caseD_5e;
    case 0xb:
      if (op_expr[0] == (ir_expression *)0x0) goto switchD_0017af5d_default;
      bVar13 = op_expr[0]->operation == ir_unop_exp2;
      break;
    case 0xc:
    case 0xd:
      if ((op_expr[0] == (ir_expression *)0x0) || (op_expr[0]->operation != ir_unop_trunc))
      goto switchD_0017af5d_default;
      piVar19 = (ir_constant *)exec_node::operator_new(0x58,pvVar20);
      iVar33 = (ir1->value).i[0];
      pgVar29 = (ir1->super_ir_rvalue).type;
      this_00 = (ir_expression *)piVar21->operands[0];
      goto LAB_0017b33b;
    default:
      goto switchD_0017af5d_default;
    }
LAB_0017b99e:
    if (bVar13) {
      piVar19 = (ir_constant *)piVar21->operands[0];
    }
    goto switchD_0017af5d_default;
  }
  piVar19 = (ir_constant *)(ir1->value).u64[1];
switchD_0017af5d_default:
  if (piVar19 != (ir_constant *)*rvalue) {
    bVar13 = glsl_type::is_vector((ir1->super_ir_rvalue).type);
    piVar26 = piVar19;
    if (((bVar13) && (pgVar29 = (piVar19->super_ir_rvalue).type, pgVar29->vector_elements == '\x01')
        ) && ((*(uint *)&pgVar29->field_0x4 & 0xfe) < 0xe)) {
      piVar26 = (ir_constant *)exec_node::operator_new(0x38,this->mem_ctx);
      ir_swizzle::ir_swizzle
                ((ir_swizzle *)piVar26,&piVar19->super_ir_rvalue,0,0,0,0,
                 (uint)((ir1->super_ir_rvalue).type)->vector_elements);
    }
    *rvalue = &piVar26->super_ir_rvalue;
    this->progress = true;
  }
  return;
}

Assistant:

void
ir_algebraic_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_expression *expr = (*rvalue)->as_expression();
   if (!expr || expr->operation == ir_quadop_vector)
      return;

   ir_rvalue *new_rvalue = handle_expression(expr);
   if (new_rvalue == *rvalue)
      return;

   /* If the expr used to be some vec OP scalar returning a vector, and the
    * optimization gave us back a scalar, we still need to turn it into a
    * vector.
    */
   *rvalue = swizzle_if_required(expr, new_rvalue);

   this->progress = true;
}